

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZVec<long> *nodeindexes)

{
  TPZRegisterClassId *in_RDI;
  TPZVec<long> *in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  TPZGeoCube *in_stack_ffffffffffffff70;
  TPZTransform<double> *in_stack_ffffffffffffff80;
  TPZRegisterClassId *local_60;
  TPZRegisterClassId *local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>>(in_RDI,0x21);
  TPZGeoCube::TPZGeoCube
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *(undefined ***)in_RDI = &PTR__TPZGeoBlend_0244fea0;
  local_38 = in_RDI + 0x50;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff60);
    local_38 = local_38 + 0x18;
  } while (local_38 != in_RDI + 0x230);
  local_60 = in_RDI + 0x230;
  do {
    TPZTransform<double>::TPZTransform(in_stack_ffffffffffffff80);
    local_60 = local_60 + 0x1a0;
  } while (local_60 != in_RDI + 0x22b0);
  return;
}

Assistant:

TPZGeoBlend(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                                                    TGeo(nodeindexes) {
        }